

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::ReadEthernetData(FpgaIO *this,quadlet_t *buffer,uint offset,uint nquads)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  __uint32_t _Var4;
  uint local_38;
  uint i;
  bool ret;
  nodeaddr_t address;
  uint nquads_local;
  uint offset_local;
  quadlet_t *buffer_local;
  FpgaIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if (uVar2 < 5) {
    this_local._7_1_ = false;
  }
  else if (nquads < 0x41) {
    pBVar1 = (this->super_BoardIO).port;
    uVar3 = (*pBVar1->_vptr_BasePort[0x26])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,(ulong)(offset + 0x4000),buffer,
                       (ulong)(nquads << 2));
    this_local._7_1_ = (bool)((byte)uVar3 & 1);
    if ((uVar3 & 1) != 0) {
      for (local_38 = 0; local_38 < nquads; local_38 = local_38 + 1) {
        _Var4 = __bswap_32(buffer[local_38]);
        buffer[local_38] = _Var4;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::ReadEthernetData(quadlet_t *buffer, unsigned int offset, unsigned int nquads)
{
    if (GetFirmwareVersion() < 5) return false;
    // Firmware currently cannot read more than 64 quadlets
    if (nquads > 64) return false;
    nodeaddr_t address = 0x4000 + offset;   // ADDR_ETH = 0x4000
    bool ret = port->ReadBlock(BoardId, address, buffer, nquads*sizeof(quadlet_t));
    if (ret) {
        for (unsigned int i = 0; i < nquads; i++)
            buffer[i] = bswap_32(buffer[i]);
    }
    return ret;
}